

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_rsqrt_s_mips64el(CPUMIPSState_conflict10 *env,uint32_t fst0)

{
  float32 fVar1;
  uintptr_t unaff_retaddr;
  uint32_t fst2;
  uint32_t fst0_local;
  CPUMIPSState_conflict10 *env_local;
  
  fVar1 = float32_sqrt_mips64el(fst0,&(env->active_fpu).fp_status);
  fVar1 = float32_div_mips64el(0x3f800000,fVar1,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint32_t helper_float_rsqrt_s(CPUMIPSState *env, uint32_t fst0)
{
    uint32_t fst2;

    fst2 = float32_sqrt(fst0, &env->active_fpu.fp_status);
    fst2 = float32_div(float32_one, fst2, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fst2;
}